

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::XThreadEvent::fire(XThreadEvent *this)

{
  long *plVar1;
  PromiseArenaMember *pPVar2;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *extraout_RDX_01;
  Event *extraout_RDX_02;
  Event *extraout_RDX_03;
  Event *extraout_RDX_04;
  Event *pEVar3;
  long *in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar4;
  PromiseArenaMember *local_578 [169];
  
  plVar1 = (long *)in_RSI[0xf];
  if (plVar1 == (long *)0x0) {
    (**(code **)(*in_RSI + 0x28))(local_578);
    pPVar2 = (PromiseArenaMember *)in_RSI[0xf];
    in_RSI[0xf] = (long)local_578[0];
    local_578[0] = (PromiseArenaMember *)0x0;
    pEVar3 = extraout_RDX_01;
    if ((pPVar2 != (PromiseArenaMember *)0x0) &&
       (PromiseDisposer::dispose(pPVar2), pPVar2 = local_578[0], pEVar3 = extraout_RDX_02,
       local_578[0] != (PromiseArenaMember *)0x0)) {
      local_578[0] = (PromiseArenaMember *)0x0;
      PromiseDisposer::dispose(pPVar2);
      pEVar3 = extraout_RDX_03;
    }
    plVar1 = (long *)in_RSI[0xf];
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))(plVar1,in_RSI + 2);
      (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)0x0;
      (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
      pEVar3 = extraout_RDX_04;
      goto LAB_003f3d64;
    }
  }
  else {
    (**(code **)(*plVar1 + 0x18))(plVar1,in_RSI[10]);
    pPVar2 = (PromiseArenaMember *)in_RSI[0xf];
    in_RSI[0xf] = 0;
    pEVar3 = extraout_RDX;
    if (pPVar2 != (PromiseArenaMember *)0x0) {
      PromiseDisposer::dispose(pPVar2);
      pEVar3 = extraout_RDX_00;
    }
  }
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&fire::DISPOSER;
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)(in_RSI + 2);
LAB_003f3d64:
  MVar4.ptr.ptr = pEVar3;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

Maybe<Own<Event>> XThreadEvent::fire() {
  static constexpr DelayedDoneHack DISPOSER {};

  KJ_IF_SOME(n, promiseNode) {
    n->get(result);
    promiseNode = kj::none;  // make sure to destroy in the thread that created it
    return Own<Event>(this, DISPOSER);
  } else {
    KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
      promiseNode = execute();
    })) {
      result.addException(kj::mv(exception));
    };
    KJ_IF_SOME(n, promiseNode) {
      n->onReady(this);
    } else {
      return Own<Event>(this, DISPOSER);
    }
  }